

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

CFeeRate __thiscall CTxMemPool::GetMinFee(CTxMemPool *this,size_t sizelimit)

{
  long lVar1;
  int64_t iVar2;
  size_t sVar3;
  CAmount CVar4;
  CFeeRate *pCVar5;
  ulong in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  double dVar6;
  double halflife;
  int64_t time;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff58;
  CFeeRate *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff78;
  double dVar7;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff98;
  double local_58;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  CAmount local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff78 >> 0x18,0));
  if (((*(byte *)(in_RDI + 0x28) & 1) == 0) ||
     ((*(double *)(in_RDI + 0x30) == 0.0 && (!NAN(*(double *)(in_RDI + 0x30)))))) {
    llround(*(double *)(in_RDI + 0x30));
    CFeeRate::CFeeRate<long_long>((CFeeRate *)in_stack_ffffffffffffff58,0x769baf);
  }
  else {
    iVar2 = GetTime();
    if (*(long *)(in_RDI + 0x20) + 10 < iVar2) {
      local_58 = 43200.0;
      sVar3 = DynamicMemoryUsage((CTxMemPool *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (sVar3 < in_RSI >> 2) {
        local_58 = 10800.0;
      }
      else {
        sVar3 = DynamicMemoryUsage((CTxMemPool *)
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if (sVar3 < in_RSI >> 1) {
          local_58 = 21600.0;
        }
      }
      dVar7 = *(double *)(in_RDI + 0x30);
      dVar6 = pow(2.0,(double)(iVar2 - *(long *)(in_RDI + 0x20)) / local_58);
      *(double *)(in_RDI + 0x30) = dVar7 / dVar6;
      *(int64_t *)(in_RDI + 0x20) = iVar2;
      dVar7 = *(double *)(in_RDI + 0x30);
      CVar4 = CFeeRate::GetFeePerK((CFeeRate *)in_stack_ffffffffffffff58);
      if (dVar7 < (double)CVar4 / 2.0) {
        *(undefined8 *)(in_RDI + 0x30) = 0;
        CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffff58,0);
        goto LAB_00769db8;
      }
    }
    llround(*(double *)(in_RDI + 0x30));
    CFeeRate::CFeeRate<long_long>((CFeeRate *)in_stack_ffffffffffffff58,0x769d7e);
    pCVar5 = std::max<CFeeRate>(in_stack_ffffffffffffff60,(CFeeRate *)in_stack_ffffffffffffff58);
    local_20 = pCVar5->nSatoshisPerK;
  }
LAB_00769db8:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (CFeeRate)local_20;
}

Assistant:

CFeeRate CTxMemPool::GetMinFee(size_t sizelimit) const {
    LOCK(cs);
    if (!blockSinceLastRollingFeeBump || rollingMinimumFeeRate == 0)
        return CFeeRate(llround(rollingMinimumFeeRate));

    int64_t time = GetTime();
    if (time > lastRollingFeeUpdate + 10) {
        double halflife = ROLLING_FEE_HALFLIFE;
        if (DynamicMemoryUsage() < sizelimit / 4)
            halflife /= 4;
        else if (DynamicMemoryUsage() < sizelimit / 2)
            halflife /= 2;

        rollingMinimumFeeRate = rollingMinimumFeeRate / pow(2.0, (time - lastRollingFeeUpdate) / halflife);
        lastRollingFeeUpdate = time;

        if (rollingMinimumFeeRate < (double)m_opts.incremental_relay_feerate.GetFeePerK() / 2) {
            rollingMinimumFeeRate = 0;
            return CFeeRate(0);
        }
    }
    return std::max(CFeeRate(llround(rollingMinimumFeeRate)), m_opts.incremental_relay_feerate);
}